

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O0

void __thiscall
leveldb::VersionSet::AddLiveFiles
          (VersionSet *this,
          set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *live)

{
  size_type sVar1;
  const_reference ppFVar2;
  ulong local_38;
  size_t i;
  vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *files;
  Version *pVStack_20;
  int level;
  Version *v;
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *live_local;
  VersionSet *this_local;
  
  for (pVStack_20 = (this->dummy_versions_).next_; pVStack_20 != &this->dummy_versions_;
      pVStack_20 = pVStack_20->next_) {
    for (files._4_4_ = 0; files._4_4_ < 7; files._4_4_ = files._4_4_ + 1) {
      local_38 = 0;
      while( true ) {
        sVar1 = std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::size
                          (pVStack_20->files_ + files._4_4_);
        if (sVar1 <= local_38) break;
        ppFVar2 = std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::
                  operator[](pVStack_20->files_ + files._4_4_,local_38);
        std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::insert
                  (live,&(*ppFVar2)->number);
        local_38 = local_38 + 1;
      }
    }
  }
  return;
}

Assistant:

void VersionSet::AddLiveFiles(std::set<uint64_t>* live) {
  for (Version* v = dummy_versions_.next_; v != &dummy_versions_;
       v = v->next_) {
    for (int level = 0; level < config::kNumLevels; level++) {
      const std::vector<FileMetaData*>& files = v->files_[level];
      for (size_t i = 0; i < files.size(); i++) {
        live->insert(files[i]->number);
      }
    }
  }
}